

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void serialize_node<std::ostream>(IsoTree *node,basic_ostream<char,_std::char_traits<char>_> *out)

{
  pointer ptr;
  size_t n_els;
  uint8_t data_en;
  size_t data_sizets [4];
  double data_doubles [6];
  undefined1 local_69;
  size_t local_68;
  size_t local_60;
  size_t sStack_58;
  long local_50;
  double local_48;
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  double local_20;
  
  if (!interrupt_switch) {
    local_69 = (undefined1)node->col_type;
    write_bytes<unsigned_char>(&local_69,1,out);
    write_bytes<int>(&node->chosen_cat,1,out);
    local_48 = node->num_split;
    local_40 = node->pct_tree_left;
    dStack_38 = node->score;
    local_30 = node->range_low;
    dStack_28 = node->range_high;
    local_20 = node->remainder;
    write_bytes<double>(&local_48,6,out);
    local_68 = node->col_num;
    local_60 = node->tree_left;
    sStack_58 = node->tree_right;
    local_50 = (long)(node->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(node->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    write_bytes<unsigned_long>(&local_68,4,out);
    ptr = (node->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    n_els = (long)(node->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptr;
    if (n_els != 0) {
      write_bytes<signed_char>(ptr,n_els,out);
    }
  }
  return;
}

Assistant:

void serialize_node(const IsoTree &node, otype &out)
{
    if (interrupt_switch) return;
    
    uint8_t data_en = (uint8_t)node.col_type;
    write_bytes<uint8_t>((void*)&data_en, (size_t)1, out);

    write_bytes<int>((void*)&node.chosen_cat, (size_t)1, out);

    double data_doubles[] = {
        node.num_split,
        node.pct_tree_left,
        node.score,
        node.range_low,
        node.range_high,
        node.remainder
    };
    write_bytes<double>((void*)data_doubles, (size_t)6, out);

    size_t data_sizets[] = {
        node.col_num,
        node.tree_left,
        node.tree_right,
        node.cat_split.size()
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)4, out);

    if (node.cat_split.size())
    write_bytes<signed char>((void*)node.cat_split.data(), node.cat_split.size(), out);
}